

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

void despot::DESPOT::Update(QNode *qnode)

{
  VNode *this;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  double dVar3;
  double dVar4;
  double dVar5;
  double value;
  
  dVar5 = qnode->step_reward;
  dVar3 = DAT_00192dd0 + dVar5;
  pmVar1 = QNode::children(qnode);
  value = dVar5;
  for (p_Var2 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    this = (VNode *)p_Var2[1]._M_parent;
    dVar4 = VNode::lower_bound(this);
    dVar5 = dVar5 + dVar4;
    dVar4 = VNode::upper_bound(this);
    value = value + dVar4;
    dVar3 = dVar3 + this->utility_upper_bound;
  }
  dVar4 = QNode::lower_bound(qnode);
  if (dVar4 < dVar5) {
    QNode::lower_bound(qnode,dVar5);
  }
  dVar5 = QNode::upper_bound(qnode);
  if (value < dVar5) {
    QNode::upper_bound(qnode,value);
  }
  if (dVar3 < qnode->utility_upper_bound) {
    qnode->utility_upper_bound = dVar3;
  }
  return;
}

Assistant:

void DESPOT::Update(QNode* qnode) {
	double lower = qnode->step_reward;
	double upper = qnode->step_reward;
	double utility_upper = qnode->step_reward
		+ Globals::config.pruning_constant;

	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
		it != children.end(); it++) {
		VNode* vnode = it->second;

		lower += vnode->lower_bound();
		upper += vnode->upper_bound();
		utility_upper += vnode->utility_upper_bound;
	}

	if (lower > qnode->lower_bound()) {
		qnode->lower_bound(lower);
	}
	if (upper < qnode->upper_bound()) {
		qnode->upper_bound(upper);
	}
	if (utility_upper < qnode->utility_upper_bound) {
		qnode->utility_upper_bound = utility_upper;
	}
}